

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O3

void __thiscall
CommandGameMode::Tick
          (CommandGameMode *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,bool hudChanged)

{
  uint uVar1;
  SBarInfoCommand **ppSVar2;
  long *plVar3;
  byte bVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  
  bVar5 = (this->super_SBarInfoCommandFlowControl).truth;
  uVar6 = (ulong)(this->super_SBarInfoCommandFlowControl).commands[bVar5].
                 super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count;
  if (uVar6 != 0) {
    ppSVar2 = (this->super_SBarInfoCommandFlowControl).commands[bVar5].
              super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array;
    lVar7 = 0;
    do {
      plVar3 = *(long **)((long)ppSVar2 + lVar7);
      (**(code **)(*plVar3 + 0x28))(plVar3,block,statusBar,hudChanged);
      lVar7 = lVar7 + 8;
    } while (uVar6 << 3 != lVar7);
  }
  if (multiplayer == false) {
    uVar1 = *(uint *)&(this->super_SBarInfoCommandFlowControl).field_0x34;
    bVar4 = (byte)uVar1;
    bVar5 = true;
    if (((uVar1 & 1) != 0) || ((uVar1 & 4) != 0 && deathmatch.Value != 0)) goto LAB_004c84c9;
  }
  else {
    uVar1 = *(uint *)&(this->super_SBarInfoCommandFlowControl).field_0x34;
    bVar4 = (byte)uVar1;
    bVar5 = true;
    if (deathmatch.Value == 0) {
      uVar1 = uVar1 & 2;
    }
    else {
      uVar1 = uVar1 & 4;
    }
    if (uVar1 != 0) goto LAB_004c84c9;
  }
  if (teamplay.Value == true) {
    bVar5 = (bool)(bVar4 >> 3 & 1);
  }
  else {
    bVar5 = false;
  }
LAB_004c84c9:
  if (((this->super_SBarInfoCommandFlowControl).truth != bVar5) &&
     ((this->super_SBarInfoCommandFlowControl).truth = bVar5, block != (SBarInfoMainBlock *)0x0)) {
    (*(this->super_SBarInfoCommandFlowControl).super_SBarInfoCommand._vptr_SBarInfoCommand[5])
              (this,block,statusBar,1);
    return;
  }
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			SBarInfoCommandFlowControl::Tick(block, statusBar, hudChanged);

			SetTruth((!multiplayer && (modes & SINGLEPLAYER)) ||
				(deathmatch && (modes & DEATHMATCH)) ||
				(multiplayer && !deathmatch && (modes & COOPERATIVE)) ||
				(teamplay && (modes & TEAMGAME)), block, statusBar);
		}